

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Gia_Man_t * Acb_NtkEcoSynthesize(Gia_Man_t *p)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  
  pGVar1 = Gia_ManDup(p);
  pGVar2 = Gia_ManAreaBalance(pGVar1,0,0,0,0);
  Gia_ManStop(pGVar1);
  iVar3 = 1;
  do {
    pGVar1 = Gia_ManCompress2(pGVar2,1,0);
    Gia_ManStop(pGVar2);
    iVar3 = iVar3 + -1;
    pGVar2 = pGVar1;
  } while (iVar3 == 0);
  iVar3 = 1;
  pGVar2 = Gia_ManAigSyn2(pGVar1,0,1,0,100,0,0,0);
  Gia_ManStop(pGVar1);
  do {
    pGVar1 = Gia_ManCompress2(pGVar2,1,0);
    Gia_ManStop(pGVar2);
    iVar3 = iVar3 + -1;
    pGVar2 = pGVar1;
  } while (iVar3 == 0);
  return pGVar1;
}

Assistant:

Gia_Man_t * Acb_NtkEcoSynthesize( Gia_Man_t * p )
{
    int Iter, fVerbose = 0;
    Gia_Man_t * pNew = Gia_ManDup( p );

    if ( fVerbose ) printf( "M_quo: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    pNew = Gia_ManAreaBalance( p = pNew, 0, 0, 0, 0 );
    Gia_ManStop( p );

    if ( fVerbose ) printf( "M_bal: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    for ( Iter = 0; Iter < 2; Iter++ )
    {
        pNew = Gia_ManCompress2( p = pNew, 1, 0 );
        Gia_ManStop( p );

        if ( fVerbose ) printf( "M_dc2: " );
        if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );
    }

    pNew = Gia_ManAigSyn2( p = pNew, 0, 1, 0, 100, 0, 0, 0 );
    Gia_ManStop( p );

    if ( fVerbose ) printf( "M_sn2: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    for ( Iter = 0; Iter < 2; Iter++ )
    {
        pNew = Gia_ManCompress2( p = pNew, 1, 0 );
        Gia_ManStop( p );

        if ( fVerbose ) printf( "M_dc2: " );
        if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );
    }
    return pNew;
}